

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

const_iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::upper_bound
          (const_iterator *__return_storage_ptr__,
          setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,key_type *k)

{
  rbtree *prVar1;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *pRVar2;
  undefined1 local_48 [8];
  iterator it;
  
  prVar1 = &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree;
  it.m_tree = (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)
              ((this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.
              m_first)->parent;
  local_48 = (undefined1  [8])&PTR__treeIterator_0010dcf0;
  it._vptr_treeIterator = (_func_int **)prVar1;
  do {
    pRVar2 = (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)
             (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_last
    ;
    if (it.m_tree == pRVar2) {
      (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_tree =
           prVar1;
      (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_node =
           (treeNode<int> *)pRVar2;
LAB_0010756d:
      (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).
      _vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dc90;
      return __return_storage_ptr__;
    }
    if (*k < *(int *)&(it.m_tree)->NIL) {
      (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_tree =
           (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *)it._vptr_treeIterator;
      (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_node =
           (treeNode<int> *)it.m_tree;
      goto LAB_0010756d;
    }
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
              ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_48);
  } while( true );
}

Assistant:

const_iterator	upper_bound(key_type const & k) const
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, *it)) return it;
		}
		return this->end();
	}